

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

bool __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
ImplicitProducer::
enqueue<(duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,duckdb::BufferEvictionNode>
          (ImplicitProducer *this,BufferEvictionNode *element)

{
  undefined8 *puVar1;
  ulong uVar2;
  long lVar3;
  long *plVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  Block *pBVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *unaff_R13;
  
  uVar2 = *(ulong *)(this + 0x20);
  uVar9 = uVar2 & 0x1f;
  if (uVar9 == 0) {
    if ((*(long *)(this + 0x28) - uVar2) + 0x7fffffffffffffdf < 0x7fffffffffffffff) {
      plVar4 = *(long **)(this + 0x60);
      if (plVar4 == (long *)0x0) {
        bVar6 = false;
      }
      else {
        uVar8 = *plVar4 - 1U & plVar4[1] + 1U;
        unaff_R13 = *(ulong **)(plVar4[3] + uVar8 * 8);
        if ((*unaff_R13 == 1) || (unaff_R13[1] == 0)) {
          *unaff_R13 = uVar2;
          plVar4[1] = uVar8;
        }
        else {
          bVar6 = ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                  ::ImplicitProducer::new_block_index((ImplicitProducer *)this);
          if (!bVar6) {
            bVar6 = false;
            goto LAB_00561a1d;
          }
          plVar4 = *(long **)(this + 0x60);
          uVar8 = *plVar4 - 1U & plVar4[1] + 1U;
          unaff_R13 = *(ulong **)(plVar4[3] + uVar8 * 8);
          *unaff_R13 = uVar2;
          plVar4[1] = uVar8;
        }
        bVar6 = true;
      }
LAB_00561a1d:
      if (bVar6) {
        pBVar7 = requisition_block<(duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
                           (*(ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                              **)(this + 0x50));
        if (pBVar7 != (Block *)0x0) {
          (pBVar7->elementsCompletelyDequeued).super___atomic_base<unsigned_long>._M_i = 0;
          unaff_R13[1] = (ulong)pBVar7;
          *(Block **)(this + 0x40) = pBVar7;
          goto LAB_00561956;
        }
        plVar4 = *(long **)(this + 0x60);
        plVar4[1] = *plVar4 - 1U & plVar4[1] - 1U;
        unaff_R13[1] = 0;
      }
    }
    bVar6 = false;
  }
  else {
LAB_00561956:
    lVar3 = *(long *)(this + 0x40);
    p_Var5 = (element->handle).internal.
             super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    puVar1 = (undefined8 *)(lVar3 + uVar9 * 0x18);
    *puVar1 = (element->handle).internal.
              super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    puVar1[1] = p_Var5;
    (element->handle).internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (element->handle).internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(idx_t *)(lVar3 + 0x10 + uVar9 * 0x18) = element->handle_sequence_number;
    *(ulong *)(this + 0x20) = uVar2 + 1;
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

inline bool enqueue(U&& element)
		{
			index_t currentTailIndex = this->tailIndex.load(std::memory_order_relaxed);
			index_t newTailIndex = 1 + currentTailIndex;
			if ((currentTailIndex & static_cast<index_t>(BLOCK_SIZE - 1)) == 0) {
				// We reached the end of a block, start a new one
				auto head = this->headIndex.load(std::memory_order_relaxed);
				assert(!details::circular_less_than<index_t>(currentTailIndex, head));
				if (!details::circular_less_than<index_t>(head, currentTailIndex + BLOCK_SIZE) || (MAX_SUBQUEUE_SIZE != details::const_numeric_max<size_t>::value && (MAX_SUBQUEUE_SIZE == 0 || MAX_SUBQUEUE_SIZE - BLOCK_SIZE < currentTailIndex - head))) {
					return false;
				}
#ifdef MCDBGQ_NOLOCKFREE_IMPLICITPRODBLOCKINDEX
				debug::DebugLock lock(mutex);
#endif
				// Find out where we'll be inserting this block in the block index
				BlockIndexEntry* idxEntry;
				if (!insert_block_index_entry<allocMode>(idxEntry, currentTailIndex)) {
					return false;
				}
				
				// Get ahold of a new block
				auto newBlock = this->parent->ConcurrentQueue::template requisition_block<allocMode>();
				if (newBlock == nullptr) {
					rewind_block_index_tail();
					idxEntry->value.store(nullptr, std::memory_order_relaxed);
					return false;
				}
#ifdef MCDBGQ_TRACKMEM
				newBlock->owner = this;
#endif
				newBlock->ConcurrentQueue::Block::template reset_empty<implicit_context>();
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new ((T*)nullptr) T(std::forward<U>(element)))) {
					// May throw, try to insert now before we publish the fact that we have this new block
					MOODYCAMEL_TRY {
						new ((*newBlock)[currentTailIndex]) T(std::forward<U>(element));
					}
					MOODYCAMEL_CATCH (...) {
						rewind_block_index_tail();
						idxEntry->value.store(nullptr, std::memory_order_relaxed);
						this->parent->add_block_to_free_list(newBlock);
						MOODYCAMEL_RETHROW;
					}
				}
				
				// Insert the new block into the index
				idxEntry->value.store(newBlock, std::memory_order_relaxed);
				
				this->tailBlock = newBlock;
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new ((T*)nullptr) T(std::forward<U>(element)))) {
					this->tailIndex.store(newTailIndex, std::memory_order_release);
					return true;
				}
			}